

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<int,_ft::allocator<int>_>::list
          (list<int,_ft::allocator<int>_> *this,list<int,_ft::allocator<int>_> *other)

{
  undefined1 local_50 [16];
  list<int,_ft::allocator<int>_> local_40;
  list<int,_ft::allocator<int>_> *local_18;
  list<int,_ft::allocator<int>_> *other_local;
  list<int,_ft::allocator<int>_> *this_local;
  
  this->m_head = (node *)0x0;
  this->m_tail = (node *)0x0;
  this->m_size = 0;
  local_18 = other;
  other_local = this;
  get_allocator((list<int,_ft::allocator<int>_> *)&stack0xffffffffffffffe7);
  allocator<ft::listNode<int>_>::allocator<int>
            ((allocator<ft::listNode<int>_> *)&this->field_0x18,
             (allocator<int> *)&stack0xffffffffffffffe7);
  allocator<int>::~allocator((allocator<int> *)&stack0xffffffffffffffe7);
  listInit(this);
  begin((list<int,_ft::allocator<int>_> *)(local_50 + 0x10));
  end((list<int,_ft::allocator<int>_> *)local_50);
  list<int,ft::allocator<int>>::assign<ft::constListIterator<int>>
            ((list<int,ft::allocator<int>> *)this,(constListIterator<int> *)(local_50 + 0x10),
             (constListIterator<int> *)local_50,(type *)0x0);
  constListIterator<int>::~constListIterator((constListIterator<int> *)local_50);
  constListIterator<int>::~constListIterator((constListIterator<int> *)(local_50 + 0x10));
  return;
}

Assistant:

list(list const & other):
		m_head(NULL),
		m_tail(NULL),
		m_size(0),
		m_alloc(other.get_allocator()) {
		this->listInit();
		this->assign(other.begin(), other.end());
	}